

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O0

int glfwGetPhysicalDevicePresentationSupport
              (VkInstance instance,VkPhysicalDevice device,uint32_t queuefamily)

{
  GLFWbool GVar1;
  int in_EDI;
  VkPhysicalDevice unaff_retaddr;
  undefined4 in_stack_00000008;
  uint32_t in_stack_fffffffffffffffc;
  int iVar2;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    iVar2 = 0;
  }
  else {
    GVar1 = _glfwInitVulkan(in_EDI);
    if (GVar1 == 0) {
      iVar2 = 0;
    }
    else if (_glfw.vk.extensions[0] == (char *)0x0) {
      _glfwInputError(0x10006,"Vulkan: Window surface creation extensions not found");
      iVar2 = 0;
    }
    else {
      iVar2 = _glfwPlatformGetPhysicalDevicePresentationSupport
                        ((VkInstance)CONCAT44(queuefamily,in_stack_00000008),unaff_retaddr,
                         in_stack_fffffffffffffffc);
    }
  }
  return iVar2;
}

Assistant:

GLFWAPI int glfwGetPhysicalDevicePresentationSupport(VkInstance instance,
                                                     VkPhysicalDevice device,
                                                     uint32_t queuefamily)
{
    assert(instance != VK_NULL_HANDLE);
    assert(device != VK_NULL_HANDLE);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (!_glfwInitVulkan(_GLFW_REQUIRE_LOADER))
        return GLFW_FALSE;

    if (!_glfw.vk.extensions[0])
    {
        _glfwInputError(GLFW_API_UNAVAILABLE,
                        "Vulkan: Window surface creation extensions not found");
        return GLFW_FALSE;
    }

    return _glfwPlatformGetPhysicalDevicePresentationSupport(instance,
                                                             device,
                                                             queuefamily);
}